

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<int&,int&>
          (QPodArrayOps<std::pair<int,int>> *this,qsizetype i,int *args,int *args_1)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  qsizetype qVar5;
  pair<int,_int> *ppVar6;
  GrowthPosition where;
  pair<int,_int> pVar7;
  
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if ((*(long *)(this + 0x10) == i) &&
       (qVar5 = QArrayDataPointer<std::pair<int,_int>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::pair<int,_int>_> *)this), qVar5 != 0)) {
      lVar3 = *(long *)(this + 8);
      lVar4 = *(long *)(this + 0x10);
      *(int *)(lVar3 + lVar4 * 8) = *args;
      *(int *)(lVar3 + 4 + lVar4 * 8) = *args_1;
      *(long *)(this + 0x10) = lVar4 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<std::pair<int,_int>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<int,_int>_> *)this), qVar5 != 0)) {
      lVar3 = *(long *)(this + 8);
      *(int *)(lVar3 + -8) = *args;
      *(int *)(lVar3 + -4) = *args_1;
      *(long *)(this + 8) = lVar3 + -8;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      return;
    }
  }
  iVar1 = *args;
  iVar2 = *args_1;
  where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
  QArrayDataPointer<std::pair<int,_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<int,_int>_> *)this,where,1,(pair<int,_int> **)0x0,
             (QArrayDataPointer<std::pair<int,_int>_> *)0x0);
  ppVar6 = QPodArrayOps<std::pair<int,_int>_>::createHole
                     ((QPodArrayOps<std::pair<int,_int>_> *)this,where,i,1);
  pVar7.second = iVar2;
  pVar7.first = iVar1;
  *ppVar6 = pVar7;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }